

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O3

void __thiscall
bssl::gtest_suite_PkitsTest04BasicCertificateRevocationTests_::
Section4ValidTwoCRLsTest7<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::
~Section4ValidTwoCRLsTest7
          (Section4ValidTwoCRLsTest7<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest04BasicCertificateRevocationTests,
                     Section4ValidTwoCRLsTest7) {
  const char* const certs[] = {"TrustAnchorRootCertificate", "TwoCRLsCACert",
                               "ValidTwoCRLsTest7EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "TwoCRLsCAGoodCRL",
                              "TwoCRLsCABadCRL"};
  PkitsTestInfo info;
  info.test_number = "4.4.7";
  info.should_validate = true;

  this->RunTest(certs, crls, info);
}